

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef fwd_ahload(jit_State *J,IRRef xref)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  IRIns *pIVar5;
  bool bVar6;
  AliasRet AVar7;
  int iVar8;
  uint uVar9;
  IRIns *pIVar10;
  ulong uVar11;
  cTValue *pcVar12;
  IRIns *pIVar13;
  TRef unaff_EBP;
  uint uVar14;
  TValue keyv;
  IRRef local_54;
  TValue local_38;
  
  pIVar5 = (J->cur).ir;
  pIVar13 = pIVar5 + xref;
  uVar14 = (uint)J->chain[(ulong)(J->fold).ins.field_1.o + 7];
  local_54 = xref;
  do {
    if (uVar14 <= xref) {
      bVar1 = (pIVar13->field_1).o;
      pIVar10 = pIVar13;
      if ((bVar1 & 0xfe) == 0x38) {
        pIVar10 = pIVar5 + (pIVar13->field_0).op1;
      }
      uVar4 = (pIVar10->field_0).op1;
      cVar2 = *(char *)((long)pIVar5 + (ulong)uVar4 * 8 + 5);
      iVar8 = 0;
      if ((cVar2 != 'O') && ((cVar2 != 'P' || ((short)(pIVar13->field_0).op2 < 0))))
      goto LAB_001327b7;
      iVar8 = fwd_aa_tab_clear(J,(uint)uVar4,(uint)uVar4);
      if (iVar8 == 0) {
        iVar8 = 0;
        goto LAB_001327b7;
      }
      if (bVar1 == 0x38) {
        uVar3 = J->chain[0x3b];
        goto LAB_00132632;
      }
      uVar11 = (ulong)(pIVar13->field_0).op2;
      if (*(char *)((long)pIVar5 + uVar11 * 8 + 5) == '\x1e') {
        uVar11 = (ulong)pIVar5[uVar11].field_0.op1;
      }
      if (((*(byte *)((long)pIVar5 + uVar11 * 8 + 4) & 0x1f) == 0xe) && (uVar4 < J->chain[0x3b])) {
        iVar8 = 5;
        bVar6 = false;
      }
      else {
        iVar8 = 0;
        bVar6 = true;
      }
      if (bVar6) goto LAB_001326b7;
      goto LAB_001327b7;
    }
    uVar11 = (ulong)uVar14;
    AVar7 = aa_ahref(J,pIVar13,pIVar5 + pIVar5[uVar11].field_0.op1);
    if (AVar7 == ALIAS_MAY) {
      iVar8 = 5;
      local_54 = uVar14;
    }
    else if (AVar7 == ALIAS_MUST) {
      unaff_EBP = (TRef)*(ushort *)((long)pIVar5 + uVar11 * 8 + 2);
      iVar8 = 1;
    }
    else {
      uVar14 = (uint)*(ushort *)((long)pIVar5 + uVar11 * 8 + 6);
      iVar8 = 0;
    }
  } while (iVar8 == 0);
  goto joined_r0x001327c3;
LAB_00132632:
  uVar9 = (uint)uVar3;
  if (uVar9 <= uVar4) goto LAB_001326a8;
  iVar8 = 5;
  if ((*(byte *)((long)pIVar5 + (ulong)*(ushort *)((long)pIVar5 + (ulong)uVar9 * 8 + 2) * 8 + 4) &
      0x1f) == 0xe) goto LAB_001326aa;
  uVar3 = *(ushort *)((long)pIVar5 + (ulong)uVar9 * 8 + 6);
  goto LAB_00132632;
LAB_001326a8:
  iVar8 = 0;
LAB_001326aa:
  if (iVar8 == 0) {
LAB_001326b7:
    do {
      if (uVar14 <= uVar4) {
        if (cVar2 == 'O') {
          unaff_EBP = 0x7fff;
        }
        else {
          pIVar13 = pIVar5 + (pIVar13->field_0).op2;
          if ((pIVar13->field_1).o == '\x1e') {
            pIVar13 = pIVar5 + (pIVar13->field_0).op1;
          }
          lj_ir_kvalue(J->L,&local_38,pIVar13);
          pcVar12 = lj_tab_get(J->L,(GCtab *)(ulong)(J->cur).ir[pIVar5[uVar4].field_0.op1].field_1.
                                                    op12,&local_38);
          uVar14 = (pcVar12->field_2).it;
          if (uVar14 < 0xfffffffd) {
            if (uVar14 < 0xfffeffff) {
              unaff_EBP = lj_ir_knum_u64(J,pcVar12->u64);
            }
            else {
              iVar8 = 0;
              if (8 < uVar14 + 0xd) break;
              unaff_EBP = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar12->u32).lo,IRT_STR);
            }
          }
          else {
            unaff_EBP = ~uVar14 * 0xffffff + 0x7fff;
          }
        }
        iVar8 = 1;
        break;
      }
      uVar11 = (ulong)uVar14;
      AVar7 = aa_ahref(J,pIVar13,pIVar5 + pIVar5[uVar11].field_0.op1);
      if (AVar7 == ALIAS_MAY) {
        iVar8 = 5;
LAB_001326f1:
        bVar6 = false;
      }
      else {
        if (AVar7 == ALIAS_MUST) {
          unaff_EBP = (TRef)*(ushort *)((long)pIVar5 + uVar11 * 8 + 2);
          iVar8 = 1;
          goto LAB_001326f1;
        }
        uVar14 = (uint)*(ushort *)((long)pIVar5 + uVar11 * 8 + 6);
        iVar8 = 0;
        bVar6 = true;
      }
    } while (bVar6);
  }
LAB_001327b7:
  if (iVar8 == 0) goto LAB_001327cc;
joined_r0x001327c3:
  if (iVar8 != 5) {
    return unaff_EBP;
  }
LAB_001327cc:
  uVar4 = J->chain[(J->fold).ins.field_1.o];
  while( true ) {
    uVar14 = (uint)uVar4;
    if (uVar14 <= local_54) {
      return 0;
    }
    pIVar13 = (J->cur).ir;
    if (pIVar13[uVar14].field_0.op1 == xref) break;
    uVar4 = *(ushort *)((long)pIVar13 + (ulong)uVar14 * 8 + 6);
  }
  return uVar14;
}

Assistant:

static TRef fwd_ahload(jit_State *J, IRRef xref)
{
  IRIns *xr = IR(xref);
  IRRef lim = xref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[fins->o+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    switch (aa_ahref(J, xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store (yet): const-fold loads from allocations. */
  {
    IRIns *ir = (xr->o == IR_HREFK || xr->o == IR_AREF) ? IR(xr->op1) : xr;
    IRRef tab = ir->op1;
    ir = IR(tab);
    if ((ir->o == IR_TNEW || (ir->o == IR_TDUP && irref_isk(xr->op2))) &&
	fwd_aa_tab_clear(J, tab, tab)) {
      /* A NEWREF with a number key may end up pointing to the array part.
      ** But it's referenced from HSTORE and not found in the ASTORE chain.
      ** Or a NEWREF may rehash the table and move unrelated number keys.
      ** For now simply consider this a conflict without forwarding anything.
      */
      if (xr->o == IR_AREF) {
	IRRef ref2 = J->chain[IR_NEWREF];
	while (ref2 > tab) {
	  IRIns *newref = IR(ref2);
	  if (irt_isnum(IR(newref->op2)->t))
	    goto cselim;
	  ref2 = newref->prev;
	}
      } else {
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	if (irt_isnum(key->t) && J->chain[IR_NEWREF] > tab)
	  goto cselim;
      }
      /* NEWREF inhibits CSE for HREF, and dependent FLOADs from HREFK/AREF.
      ** But the above search for conflicting stores was limited by xref.
      ** So continue searching, limited by the TNEW/TDUP. Store forwarding
      ** is ok, too. A conflict does NOT limit the search for a matching load.
      */
      while (ref > tab) {
	IRIns *store = IR(ref);
	switch (aa_ahref(J, xr, IR(store->op1))) {
	case ALIAS_NO:   break;  /* Continue searching. */
	case ALIAS_MAY:  goto cselim;  /* Conflicting store. */
	case ALIAS_MUST: return store->op2;  /* Store forwarding. */
	}
	ref = store->prev;
      }
      /* Simplified here: let loop_unroll() figure out any type instability. */
      if (ir->o == IR_TNEW) {
	return TREF_NIL;
      } else {
	TValue keyv;
	cTValue *tv;
	IRIns *key = IR(xr->op2);
	if (key->o == IR_KSLOT) key = IR(key->op1);
	lj_ir_kvalue(J->L, &keyv, key);
	tv = lj_tab_get(J->L, ir_ktab(IR(ir->op1)), &keyv);
	if (tvispri(tv))
	  return TREF_PRI(itype2irt(tv));
	else if (tvisnum(tv))
	  return lj_ir_knum_u64(J, tv->u64);
	else if (tvisint(tv))
	  return lj_ir_kint(J, intV(tv));
	else if (tvisgcv(tv))
	  return lj_ir_kstr(J, strV(tv));
      }
      /* Othwerwise: don't intern as a constant. */
    }
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[fins->o];
  while (ref > lim) {
    IRIns *load = IR(ref);
    if (load->op1 == xref)
      return ref;  /* Load forwarding. */
    ref = load->prev;
  }
  return 0;  /* Conflict or no match. */
}